

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag_set.cpp
# Opt level: O0

void check_set(flag_set<test_flags> *set,bool a,bool b,bool c)

{
  flag_set<test_flags> *this;
  bool bVar1;
  Flags FVar2;
  Decomposer local_198a;
  ExprLhs<bool> local_1989;
  StringRef local_1988;
  SourceLineInfo local_1978;
  StringRef local_1968;
  undefined1 local_1958 [8];
  AssertionHandler catchAssertionHandler_39;
  test_flags local_1908;
  flag_combo<test_flags> local_1904;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_1903;
  Decomposer local_1902;
  ExprLhs<bool> local_1901;
  StringRef local_1900;
  SourceLineInfo local_18f0;
  StringRef local_18e0;
  undefined1 local_18d0 [8];
  AssertionHandler catchAssertionHandler_38;
  test_flags local_1880;
  flag_combo<test_flags> local_187b;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_187a;
  Decomposer local_1879;
  flag_set<test_flags> *local_1878;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_1870;
  StringRef local_1840;
  SourceLineInfo local_1830;
  StringRef local_1820;
  undefined1 local_1810 [8];
  AssertionHandler catchAssertionHandler_37;
  StringRef local_17c0;
  SourceLineInfo local_17b0;
  StringRef local_17a0;
  undefined1 local_1790 [8];
  AssertionHandler catchAssertionHandler_36;
  test_flags local_1740;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_173b;
  Decomposer local_173a;
  ExprLhs<bool> local_1739;
  StringRef local_1738;
  SourceLineInfo local_1728;
  StringRef local_1718;
  undefined1 local_1708 [8];
  AssertionHandler catchAssertionHandler_35;
  flag_set<test_flags> *local_16b8;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_16b0;
  StringRef local_1680;
  SourceLineInfo local_1670;
  StringRef local_1660;
  undefined1 local_1650 [8];
  AssertionHandler catchAssertionHandler_34;
  test_flags local_1600;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_15fa;
  Decomposer local_15f9;
  flag_set<test_flags> *local_15f8;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_15f0;
  StringRef local_15c0;
  SourceLineInfo local_15b0;
  StringRef local_15a0;
  undefined1 local_1590 [8];
  AssertionHandler catchAssertionHandler_33;
  test_flags local_1540;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_153b;
  Decomposer local_153a;
  ExprLhs<bool> local_1539;
  StringRef local_1538;
  SourceLineInfo local_1528;
  StringRef local_1518;
  undefined1 local_1508 [8];
  AssertionHandler catchAssertionHandler_32;
  flag_set<test_flags> *local_14b8;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_14b0;
  StringRef local_1480;
  SourceLineInfo local_1470;
  StringRef local_1460;
  undefined1 local_1450 [8];
  AssertionHandler catchAssertionHandler_31;
  test_flags local_1400;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_13fa;
  Decomposer local_13f9;
  flag_set<test_flags> *local_13f8;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_13f0;
  StringRef local_13c0;
  SourceLineInfo local_13b0;
  StringRef local_13a0;
  undefined1 local_1390 [8];
  AssertionHandler catchAssertionHandler_30;
  StringRef local_1340;
  SourceLineInfo local_1330;
  StringRef local_1320;
  undefined1 local_1310 [8];
  AssertionHandler catchAssertionHandler_29;
  test_flags local_12c0;
  flag_mask<test_flags> local_12bc;
  flag_mask<test_flags> local_12bb;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_12ba;
  Decomposer local_12b9;
  flag_set<test_flags> *local_12b8;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_12b0;
  StringRef local_1280;
  SourceLineInfo local_1270;
  StringRef local_1260;
  undefined1 local_1250 [8];
  AssertionHandler catchAssertionHandler_28;
  flag_set<test_flags> *local_1200;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&> local_11f8;
  StringRef local_11c8;
  SourceLineInfo local_11b8;
  StringRef local_11a8;
  undefined1 local_1198 [8];
  AssertionHandler catchAssertionHandler_27;
  test_flags local_1148;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_1143;
  Decomposer local_1142;
  ExprLhs<bool> local_1141;
  StringRef local_1140;
  SourceLineInfo local_1130;
  StringRef local_1120;
  undefined1 local_1110 [8];
  AssertionHandler catchAssertionHandler_26;
  flag_set<test_flags> *local_10c0;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_10b8;
  StringRef local_1088;
  SourceLineInfo local_1078;
  StringRef local_1068;
  undefined1 local_1058 [8];
  AssertionHandler catchAssertionHandler_25;
  test_flags local_1008;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_1002;
  Decomposer local_1001;
  flag_set<test_flags> *local_1000;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_ff8;
  StringRef local_fc8;
  SourceLineInfo local_fb8;
  StringRef local_fa8;
  undefined1 local_f98 [8];
  AssertionHandler catchAssertionHandler_24;
  StringRef local_f48;
  SourceLineInfo local_f38;
  StringRef local_f28;
  undefined1 local_f18 [8];
  AssertionHandler catchAssertionHandler_23;
  test_flags local_ec8;
  flag_mask<test_flags> local_ec4;
  flag_mask<test_flags> local_ec3;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_ec2;
  Decomposer local_ec1;
  flag_set<test_flags> *local_ec0;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_eb8;
  StringRef local_e88;
  SourceLineInfo local_e78;
  StringRef local_e68;
  undefined1 local_e58 [8];
  AssertionHandler catchAssertionHandler_22;
  flag_set<test_flags> *local_e08;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&> local_e00;
  StringRef local_dd0;
  SourceLineInfo local_dc0;
  StringRef local_db0;
  undefined1 local_da0 [8];
  AssertionHandler catchAssertionHandler_21;
  StringRef local_d50;
  SourceLineInfo local_d40;
  StringRef local_d30;
  undefined1 local_d20 [8];
  AssertionHandler catchAssertionHandler_20;
  test_flags local_cd0;
  flag_mask<test_flags> local_ccc;
  flag_mask<test_flags> local_ccb;
  flag_set_impl<test_flags,_type_safe::detail::combo_tag> local_cca;
  Decomposer local_cc9;
  flag_set<test_flags> *local_cc8;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
  local_cc0;
  StringRef local_c90;
  SourceLineInfo local_c80;
  StringRef local_c70;
  undefined1 local_c60 [8];
  AssertionHandler catchAssertionHandler_19;
  flag_set<test_flags> *local_c10;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&> local_c08;
  StringRef local_bd8;
  SourceLineInfo local_bc8;
  StringRef local_bb8;
  undefined1 local_ba8 [8];
  AssertionHandler catchAssertionHandler_18;
  flag_set<test_flags> *local_b58;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::flag_set<test_flags>_&>
  local_b50;
  StringRef local_b20;
  SourceLineInfo local_b10;
  StringRef local_b00;
  undefined1 local_af0 [8];
  AssertionHandler catchAssertionHandler_17;
  int number;
  BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&> local_a98;
  StringRef local_a68;
  SourceLineInfo local_a58;
  StringRef local_a48;
  undefined1 local_a38 [8];
  AssertionHandler catchAssertionHandler_16;
  flag_set<test_flags> *local_9e8;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::noflag_t_&> local_9e0;
  StringRef local_9b0;
  SourceLineInfo local_9a0;
  StringRef local_990;
  undefined1 local_980 [8];
  AssertionHandler catchAssertionHandler_15;
  StringRef local_930;
  SourceLineInfo local_920;
  StringRef local_910;
  undefined1 local_900 [8];
  AssertionHandler catchAssertionHandler_14;
  StringRef local_8b0;
  SourceLineInfo local_8a0;
  StringRef local_890;
  undefined1 local_880 [8];
  AssertionHandler catchAssertionHandler_13;
  noflag_t *local_830;
  BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&> local_828;
  StringRef local_7f8;
  SourceLineInfo local_7e8;
  StringRef local_7d8;
  undefined1 local_7c8 [8];
  AssertionHandler catchAssertionHandler_12;
  flag_set<test_flags> *local_778;
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::noflag_t_&> local_770;
  StringRef local_740;
  SourceLineInfo local_730;
  StringRef local_720;
  undefined1 local_710 [8];
  AssertionHandler catchAssertionHandler_11;
  StringRef local_6c0;
  SourceLineInfo local_6b0;
  StringRef local_6a0;
  undefined1 local_690 [8];
  AssertionHandler catchAssertionHandler_10;
  StringRef local_640;
  SourceLineInfo local_630;
  StringRef local_620;
  undefined1 local_610 [8];
  AssertionHandler catchAssertionHandler_9;
  StringRef local_5c0;
  SourceLineInfo local_5b0;
  StringRef local_5a0;
  undefined1 local_590 [8];
  AssertionHandler catchAssertionHandler_8;
  ExprLhs<const_type_safe::flag_&> local_540;
  BinaryExpr<const_type_safe::flag_&,_bool> local_538;
  StringRef local_508;
  SourceLineInfo local_4f8;
  StringRef local_4e8;
  undefined1 local_4d8 [8];
  AssertionHandler catchAssertionHandler_7;
  BinaryExpr<bool,_bool> local_488;
  StringRef local_460;
  SourceLineInfo local_450;
  StringRef local_440;
  undefined1 local_430 [8];
  AssertionHandler catchAssertionHandler_6;
  StringRef local_3e0;
  SourceLineInfo local_3d0;
  StringRef local_3c0;
  undefined1 local_3b0 [8];
  AssertionHandler catchAssertionHandler_5;
  ExprLhs<const_type_safe::flag_&> local_360;
  BinaryExpr<const_type_safe::flag_&,_bool> local_358;
  StringRef local_328;
  SourceLineInfo local_318;
  StringRef local_308;
  undefined1 local_2f8 [8];
  AssertionHandler catchAssertionHandler_4;
  BinaryExpr<bool,_bool> local_2a8;
  StringRef local_280;
  SourceLineInfo local_270;
  StringRef local_260;
  undefined1 local_250 [8];
  AssertionHandler catchAssertionHandler_3;
  StringRef local_200;
  SourceLineInfo local_1f0;
  StringRef local_1e0;
  undefined1 local_1d0 [8];
  AssertionHandler catchAssertionHandler_2;
  ExprLhs<const_type_safe::flag_&> local_180;
  BinaryExpr<const_type_safe::flag_&,_bool> local_178;
  StringRef local_148;
  SourceLineInfo local_138;
  StringRef local_128;
  undefined1 local_118 [8];
  AssertionHandler catchAssertionHandler_1;
  test_flags local_c0;
  Decomposer local_ba;
  ExprLhs<bool> local_b9;
  BinaryExpr<bool,_bool> local_b8;
  StringRef local_90;
  SourceLineInfo local_80;
  StringRef local_70;
  undefined1 local_60 [8];
  AssertionHandler catchAssertionHandler;
  bool c_local;
  bool b_local;
  bool a_local;
  flag_set<test_flags> *set_local;
  
  catchAssertionHandler.m_resultCapture._5_1_ = c;
  catchAssertionHandler.m_resultCapture._6_1_ = b;
  catchAssertionHandler.m_resultCapture._7_1_ = a;
  local_70 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
             ,0x20);
  Catch::StringRef::StringRef(&local_90,"set.is_set(test_flags::a) == a");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_60,&local_70,&local_80,local_90,Normal);
  local_c0 = a;
  bVar1 = type_safe::flag_set<test_flags>::is_set(set,&local_c0);
  local_b9 = Catch::Decomposer::operator<=(&local_ba,bVar1);
  Catch::ExprLhs<bool>::operator==
            (&local_b8,&local_b9,(bool)(catchAssertionHandler.m_resultCapture._7_1_ & 1));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_60,&local_b8.super_ITransientExpression);
  Catch::BinaryExpr<bool,_bool>::~BinaryExpr(&local_b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_60);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_60);
  local_128 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
             ,0x21);
  Catch::StringRef::StringRef(&local_148,"set.as_flag(test_flags::a) == a");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_118,&local_128,&local_138,local_148,Normal);
  catchAssertionHandler_2.m_resultCapture._0_4_ = 0;
  catchAssertionHandler_2.m_resultCapture._6_1_ =
       type_safe::flag_set<test_flags>::as_flag
                 (set,(test_flags *)&catchAssertionHandler_2.m_resultCapture);
  local_180 = Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&catchAssertionHandler_2.m_resultCapture + 7),
                         (flag *)((long)&catchAssertionHandler_2.m_resultCapture + 6));
  Catch::ExprLhs<const_type_safe::flag_&>::operator==
            (&local_178,&local_180,(bool)(catchAssertionHandler.m_resultCapture._7_1_ & 1));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_118,&local_178.super_ITransientExpression);
  Catch::BinaryExpr<const_type_safe::flag_&,_bool>::~BinaryExpr(&local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_118);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_118);
  if ((catchAssertionHandler.m_resultCapture._7_1_ & 1) != 0) {
    local_1e0 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x23);
    Catch::StringRef::StringRef(&local_200,"(set & test_flags::a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1d0,&local_1e0,&local_1f0,local_200,Normal);
    catchAssertionHandler_3.m_resultCapture._0_4_ = 0;
    bVar1 = type_safe::operator&(set,(test_flags *)&catchAssertionHandler_3.m_resultCapture);
    catchAssertionHandler_3.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_3.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1d0,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_3.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1d0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1d0);
  }
  local_260 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
             ,0x25);
  Catch::StringRef::StringRef(&local_280,"set.is_set(test_flags::b) == b");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_250,&local_260,&local_270,local_280,Normal);
  catchAssertionHandler_4.m_resultCapture._0_4_ = 1;
  bVar1 = type_safe::flag_set<test_flags>::is_set
                    (set,(test_flags *)&catchAssertionHandler_4.m_resultCapture);
  catchAssertionHandler_4.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_4.m_resultCapture + 6),bVar1);
  Catch::ExprLhs<bool>::operator==
            (&local_2a8,(ExprLhs<bool> *)((long)&catchAssertionHandler_4.m_resultCapture + 7),
             (bool)(catchAssertionHandler.m_resultCapture._6_1_ & 1));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_250,&local_2a8.super_ITransientExpression);
  Catch::BinaryExpr<bool,_bool>::~BinaryExpr(&local_2a8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_250);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_250);
  local_308 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_318,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
             ,0x26);
  Catch::StringRef::StringRef(&local_328,"set.as_flag(test_flags::b) == b");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2f8,&local_308,&local_318,local_328,Normal);
  catchAssertionHandler_5.m_resultCapture._0_4_ = 1;
  catchAssertionHandler_5.m_resultCapture._6_1_ =
       type_safe::flag_set<test_flags>::as_flag
                 (set,(test_flags *)&catchAssertionHandler_5.m_resultCapture);
  local_360 = Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&catchAssertionHandler_5.m_resultCapture + 7),
                         (flag *)((long)&catchAssertionHandler_5.m_resultCapture + 6));
  Catch::ExprLhs<const_type_safe::flag_&>::operator==
            (&local_358,&local_360,(bool)(catchAssertionHandler.m_resultCapture._6_1_ & 1));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2f8,&local_358.super_ITransientExpression);
  Catch::BinaryExpr<const_type_safe::flag_&,_bool>::~BinaryExpr(&local_358);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2f8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2f8);
  if ((catchAssertionHandler.m_resultCapture._6_1_ & 1) != 0) {
    local_3c0 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_3d0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x28);
    Catch::StringRef::StringRef(&local_3e0,"(set & test_flags::b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_3b0,&local_3c0,&local_3d0,local_3e0,Normal);
    catchAssertionHandler_6.m_resultCapture._0_4_ = 1;
    bVar1 = type_safe::operator&(set,(test_flags *)&catchAssertionHandler_6.m_resultCapture);
    catchAssertionHandler_6.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_6.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_3b0,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_6.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_3b0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3b0);
  }
  local_440 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_450,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
             ,0x2a);
  Catch::StringRef::StringRef(&local_460,"set.is_set(test_flags::c) == c");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_430,&local_440,&local_450,local_460,Normal);
  catchAssertionHandler_7.m_resultCapture._0_4_ = 2;
  bVar1 = type_safe::flag_set<test_flags>::is_set
                    (set,(test_flags *)&catchAssertionHandler_7.m_resultCapture);
  catchAssertionHandler_7.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_7.m_resultCapture + 6),bVar1);
  Catch::ExprLhs<bool>::operator==
            (&local_488,(ExprLhs<bool> *)((long)&catchAssertionHandler_7.m_resultCapture + 7),
             (bool)(catchAssertionHandler.m_resultCapture._5_1_ & 1));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_430,&local_488.super_ITransientExpression);
  Catch::BinaryExpr<bool,_bool>::~BinaryExpr(&local_488);
  Catch::AssertionHandler::complete((AssertionHandler *)local_430);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_430);
  local_4e8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_4f8,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
             ,0x2b);
  Catch::StringRef::StringRef(&local_508,"set.as_flag(test_flags::c) == c");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_4d8,&local_4e8,&local_4f8,local_508,Normal);
  catchAssertionHandler_8.m_resultCapture._0_4_ = 2;
  catchAssertionHandler_8.m_resultCapture._6_1_ =
       type_safe::flag_set<test_flags>::as_flag
                 (set,(test_flags *)&catchAssertionHandler_8.m_resultCapture);
  local_540 = Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&catchAssertionHandler_8.m_resultCapture + 7),
                         (flag *)((long)&catchAssertionHandler_8.m_resultCapture + 6));
  Catch::ExprLhs<const_type_safe::flag_&>::operator==
            (&local_538,&local_540,(bool)(catchAssertionHandler.m_resultCapture._5_1_ & 1));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_4d8,&local_538.super_ITransientExpression);
  Catch::BinaryExpr<const_type_safe::flag_&,_bool>::~BinaryExpr(&local_538);
  Catch::AssertionHandler::complete((AssertionHandler *)local_4d8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_4d8);
  if ((catchAssertionHandler.m_resultCapture._5_1_ & 1) != 0) {
    local_5a0 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5b0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x2d);
    Catch::StringRef::StringRef(&local_5c0,"(set & test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_590,&local_5a0,&local_5b0,local_5c0,Normal);
    catchAssertionHandler_9.m_resultCapture._0_4_ = 2;
    bVar1 = type_safe::operator&(set,(test_flags *)&catchAssertionHandler_9.m_resultCapture);
    catchAssertionHandler_9.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_9.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_590,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_9.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_590);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_590);
  }
  if ((((catchAssertionHandler.m_resultCapture._7_1_ & 1) == 0) &&
      ((catchAssertionHandler.m_resultCapture._6_1_ & 1) == 0)) &&
     ((catchAssertionHandler.m_resultCapture._5_1_ & 1) == 0)) {
    local_890 = operator____catch_sr("REQUIRE_FALSE",0xd);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_8a0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x38);
    Catch::StringRef::StringRef(&local_8b0,"set.any()");
    FVar2 = Catch::operator|(Normal,FalseTest);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_880,&local_890,&local_8a0,local_8b0,FVar2);
    bVar1 = type_safe::flag_set<test_flags>::any(set);
    catchAssertionHandler_14.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_14.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_880,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_14.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_880);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_880);
    local_910 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_920,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x39);
    Catch::StringRef::StringRef(&local_930,"set.none()");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_900,&local_910,&local_920,local_930,Normal);
    bVar1 = type_safe::flag_set<test_flags>::none(set);
    catchAssertionHandler_15.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_15.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_900,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_15.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_900);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_900);
    local_990 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_9a0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x3a);
    Catch::StringRef::StringRef(&local_9b0,"set == type_safe::noflag");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_980,&local_990,&local_9a0,local_9b0,Normal);
    local_9e8 = (flag_set<test_flags> *)
                Catch::Decomposer::operator<=
                          ((Decomposer *)((long)&catchAssertionHandler_16.m_resultCapture + 7),set);
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_9e0,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_9e8,
               (noflag_t *)&type_safe::noflag);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_980,&local_9e0.super_ITransientExpression);
    Catch::BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::noflag_t_&>::
    ~BinaryExpr(&local_9e0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_980);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_980);
    local_a48 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_a58,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x3b);
    Catch::StringRef::StringRef(&local_a68,"type_safe::noflag == set");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_a38,&local_a48,&local_a58,local_a68,Normal);
    _number = Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&catchAssertionHandler_17.m_resultCapture + 7),
                         (noflag_t *)&type_safe::noflag);
    Catch::ExprLhs<type_safe::noflag_t_const&>::operator==
              (&local_a98,(ExprLhs<type_safe::noflag_t_const&> *)&number,set);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_a38,&local_a98.super_ITransientExpression);
    Catch::BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&>::
    ~BinaryExpr(&local_a98);
    Catch::AssertionHandler::complete((AssertionHandler *)local_a38);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_a38);
  }
  else {
    local_620 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_630,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x31);
    Catch::StringRef::StringRef(&local_640,"set.any()");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_610,&local_620,&local_630,local_640,Normal);
    bVar1 = type_safe::flag_set<test_flags>::any(set);
    catchAssertionHandler_10.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_10.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_610,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_10.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_610);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_610);
    local_6a0 = operator____catch_sr("REQUIRE_FALSE",0xd);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_6b0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x32);
    Catch::StringRef::StringRef(&local_6c0,"set.none()");
    FVar2 = Catch::operator|(Normal,FalseTest);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_690,&local_6a0,&local_6b0,local_6c0,FVar2);
    bVar1 = type_safe::flag_set<test_flags>::none(set);
    catchAssertionHandler_11.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_11.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_690,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_11.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_690);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_690);
    local_720 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_730,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x33);
    Catch::StringRef::StringRef(&local_740,"set != type_safe::noflag");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_710,&local_720,&local_730,local_740,Normal);
    local_778 = (flag_set<test_flags> *)
                Catch::Decomposer::operator<=
                          ((Decomposer *)((long)&catchAssertionHandler_12.m_resultCapture + 7),set);
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator!=
              (&local_770,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_778,
               (noflag_t *)&type_safe::noflag);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_710,&local_770.super_ITransientExpression);
    Catch::BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::noflag_t_&>::
    ~BinaryExpr(&local_770);
    Catch::AssertionHandler::complete((AssertionHandler *)local_710);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_710);
    local_7d8 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_7e8,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x34);
    Catch::StringRef::StringRef(&local_7f8,"type_safe::noflag != set");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_7c8,&local_7d8,&local_7e8,local_7f8,Normal);
    local_830 = (noflag_t *)
                Catch::Decomposer::operator<=
                          ((Decomposer *)((long)&catchAssertionHandler_13.m_resultCapture + 7),
                           (noflag_t *)&type_safe::noflag);
    Catch::ExprLhs<type_safe::noflag_t_const&>::operator!=
              (&local_828,(ExprLhs<type_safe::noflag_t_const&> *)&local_830,set);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_7c8,&local_828.super_ITransientExpression);
    Catch::BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&>::
    ~BinaryExpr(&local_828);
    Catch::AssertionHandler::complete((AssertionHandler *)local_7c8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_7c8);
  }
  catchAssertionHandler_17.m_resultCapture._0_4_ =
       (catchAssertionHandler.m_resultCapture._6_1_ & 1) * 2 +
       (catchAssertionHandler.m_resultCapture._7_1_ & 1) * 4 |
       catchAssertionHandler.m_resultCapture._5_1_ & 1;
  switch((uint)catchAssertionHandler_17.m_resultCapture) {
  case 0:
    local_b00 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_b10,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x42);
    Catch::StringRef::StringRef(&local_b20,"set == type_safe::flag_set<test_flags>()");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_af0,&local_b00,&local_b10,local_b20,Normal);
    local_b58 = (flag_set<test_flags> *)
                Catch::Decomposer::operator<=
                          ((Decomposer *)((long)&catchAssertionHandler_18.m_resultCapture + 7),set);
    this = (flag_set<test_flags> *)((long)&catchAssertionHandler_18.m_resultCapture + 6);
    type_safe::flag_set<test_flags>::flag_set(this);
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_b50,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_b58,this);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_af0,&local_b50.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::flag_set<test_flags>_&>::
    ~BinaryExpr(&local_b50);
    Catch::AssertionHandler::complete((AssertionHandler *)local_af0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_af0);
    break;
  case 1:
    local_bb8 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_bc8,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x45);
    Catch::StringRef::StringRef(&local_bd8,"set == test_flags::c");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_ba8,&local_bb8,&local_bc8,local_bd8,Normal);
    local_c10 = (flag_set<test_flags> *)
                Catch::Decomposer::operator<=
                          ((Decomposer *)((long)&catchAssertionHandler_19.m_resultCapture + 7),set);
    catchAssertionHandler_19.m_resultCapture._0_4_ = 2;
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_c08,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_c10,
               (test_flags *)&catchAssertionHandler_19.m_resultCapture);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_ba8,&local_c08.super_ITransientExpression);
    Catch::BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&>::~BinaryExpr
              (&local_c08);
    Catch::AssertionHandler::complete((AssertionHandler *)local_ba8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_ba8);
    local_c70 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_c80,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x46);
    Catch::StringRef::StringRef
              (&local_c90,"set == type_safe::combo(~test_flags::a & ~test_flags::b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_c60,&local_c70,&local_c80,local_c90,Normal);
    local_cc8 = (flag_set<test_flags> *)Catch::Decomposer::operator<=(&local_cc9,set);
    local_cd0 = a;
    local_ccc.bits_ = (int_type)operator~(&local_cd0);
    catchAssertionHandler_20.m_resultCapture._0_4_ = 1;
    catchAssertionHandler_20.m_resultCapture._7_1_ =
         operator~((test_flags *)&catchAssertionHandler_20.m_resultCapture);
    local_ccb.bits_ =
         (int_type)
         type_safe::detail::operator&
                   (&local_ccc,
                    (flag_mask<test_flags> *)((long)&catchAssertionHandler_20.m_resultCapture + 7));
    local_cca.bits_ = (int_type)type_safe::combo<test_flags>(&local_ccb);
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_cc0,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_cc8,&local_cca);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_c60,&local_cc0.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_cc0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_c60);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_c60);
    local_d30 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_d40,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x47);
    Catch::StringRef::StringRef(&local_d50,"(set & test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_d20,&local_d30,&local_d40,local_d50,Normal);
    catchAssertionHandler_21.m_resultCapture._0_4_ = 2;
    bVar1 = type_safe::operator&(set,(test_flags *)&catchAssertionHandler_21.m_resultCapture);
    catchAssertionHandler_21.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_21.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_d20,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_21.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_d20);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_d20);
    break;
  case 2:
    local_db0 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_dc0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x4a);
    Catch::StringRef::StringRef(&local_dd0,"set == test_flags::b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_da0,&local_db0,&local_dc0,local_dd0,Normal);
    local_e08 = (flag_set<test_flags> *)
                Catch::Decomposer::operator<=
                          ((Decomposer *)((long)&catchAssertionHandler_22.m_resultCapture + 7),set);
    catchAssertionHandler_22.m_resultCapture._0_4_ = 1;
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_e00,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_e08,
               (test_flags *)&catchAssertionHandler_22.m_resultCapture);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_da0,&local_e00.super_ITransientExpression);
    Catch::BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&>::~BinaryExpr
              (&local_e00);
    Catch::AssertionHandler::complete((AssertionHandler *)local_da0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_da0);
    local_e68 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_e78,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x4b);
    Catch::StringRef::StringRef
              (&local_e88,"set == type_safe::combo(~test_flags::a & ~test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_e58,&local_e68,&local_e78,local_e88,Normal);
    local_ec0 = (flag_set<test_flags> *)Catch::Decomposer::operator<=(&local_ec1,set);
    local_ec8 = a;
    local_ec4.bits_ = (int_type)operator~(&local_ec8);
    catchAssertionHandler_23.m_resultCapture._0_4_ = 2;
    catchAssertionHandler_23.m_resultCapture._7_1_ =
         operator~((test_flags *)&catchAssertionHandler_23.m_resultCapture);
    local_ec3.bits_ =
         (int_type)
         type_safe::detail::operator&
                   (&local_ec4,
                    (flag_mask<test_flags> *)((long)&catchAssertionHandler_23.m_resultCapture + 7));
    local_ec2.bits_ = (int_type)type_safe::combo<test_flags>(&local_ec3);
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_eb8,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_ec0,&local_ec2);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_e58,&local_eb8.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_eb8);
    Catch::AssertionHandler::complete((AssertionHandler *)local_e58);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_e58);
    local_f28 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_f38,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x4c);
    Catch::StringRef::StringRef(&local_f48,"(set & test_flags::b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_f18,&local_f28,&local_f38,local_f48,Normal);
    catchAssertionHandler_24.m_resultCapture._0_4_ = 1;
    bVar1 = type_safe::operator&(set,(test_flags *)&catchAssertionHandler_24.m_resultCapture);
    catchAssertionHandler_24.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_24.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_f18,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_24.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_f18);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_f18);
    break;
  case 3:
    local_fa8 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_fb8,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x4f);
    Catch::StringRef::StringRef(&local_fc8,"set == (test_flags::b | test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_f98,&local_fa8,&local_fb8,local_fc8,Normal);
    local_1000 = (flag_set<test_flags> *)Catch::Decomposer::operator<=(&local_1001,set);
    local_1008 = b;
    catchAssertionHandler_25.m_resultCapture._4_4_ = 2;
    local_1002.bits_ =
         (int_type)
         operator|(&stack0xffffffffffffeff8,
                   (test_flags *)((long)&catchAssertionHandler_25.m_resultCapture + 4));
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_ff8,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_1000,&local_1002)
    ;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_f98,&local_ff8.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_ff8);
    Catch::AssertionHandler::complete((AssertionHandler *)local_f98);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_f98);
    local_1068 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1078,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x50);
    Catch::StringRef::StringRef(&local_1088,"set == type_safe::combo(~test_flags::a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1058,&local_1068,&local_1078,local_1088,Normal);
    local_10c0 = (flag_set<test_flags> *)
                 Catch::Decomposer::operator<=
                           ((Decomposer *)((long)&catchAssertionHandler_26.m_resultCapture + 7),set)
    ;
    catchAssertionHandler_26.m_resultCapture._0_4_ = 0;
    catchAssertionHandler_26.m_resultCapture._5_1_ =
         operator~((test_flags *)&catchAssertionHandler_26.m_resultCapture);
    catchAssertionHandler_26.m_resultCapture._6_1_ =
         type_safe::combo<test_flags>
                   ((flag_mask<test_flags> *)((long)&catchAssertionHandler_26.m_resultCapture + 5));
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_10b8,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_10c0,
               (flag_set_impl<test_flags,_type_safe::detail::combo_tag> *)
               ((long)&catchAssertionHandler_26.m_resultCapture + 6));
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_1058,&local_10b8.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_10b8);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1058);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1058);
    local_1120 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1130,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x51);
    Catch::StringRef::StringRef(&local_1140,"(set & (test_flags::b | test_flags::c))");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1110,&local_1120,&local_1130,local_1140,Normal);
    local_1148 = b;
    catchAssertionHandler_27.m_resultCapture._4_4_ = 2;
    local_1143.bits_ =
         (int_type)
         operator|(&stack0xffffffffffffeeb8,
                   (test_flags *)((long)&catchAssertionHandler_27.m_resultCapture + 4));
    bVar1 = type_safe::operator&(set,&local_1143);
    local_1141 = Catch::Decomposer::operator<=(&local_1142,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1110,&local_1141);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1110);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1110);
    break;
  case 4:
    local_11a8 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_11b8,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x54);
    Catch::StringRef::StringRef(&local_11c8,"set == test_flags::a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1198,&local_11a8,&local_11b8,local_11c8,Normal);
    local_1200 = (flag_set<test_flags> *)
                 Catch::Decomposer::operator<=
                           ((Decomposer *)((long)&catchAssertionHandler_28.m_resultCapture + 7),set)
    ;
    catchAssertionHandler_28.m_resultCapture._0_4_ = 0;
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_11f8,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_1200,
               (test_flags *)&catchAssertionHandler_28.m_resultCapture);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_1198,&local_11f8.super_ITransientExpression);
    Catch::BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&>::~BinaryExpr
              (&local_11f8);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1198);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1198);
    local_1260 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1270,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x55);
    Catch::StringRef::StringRef
              (&local_1280,"set == type_safe::combo(~test_flags::b & ~test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1250,&local_1260,&local_1270,local_1280,Normal);
    local_12b8 = (flag_set<test_flags> *)Catch::Decomposer::operator<=(&local_12b9,set);
    local_12c0 = b;
    local_12bc.bits_ = (int_type)operator~(&local_12c0);
    catchAssertionHandler_29.m_resultCapture._0_4_ = 2;
    catchAssertionHandler_29.m_resultCapture._7_1_ =
         operator~((test_flags *)&catchAssertionHandler_29.m_resultCapture);
    local_12bb.bits_ =
         (int_type)
         type_safe::detail::operator&
                   (&local_12bc,
                    (flag_mask<test_flags> *)((long)&catchAssertionHandler_29.m_resultCapture + 7));
    local_12ba.bits_ = (int_type)type_safe::combo<test_flags>(&local_12bb);
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_12b0,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_12b8,&local_12ba
              );
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_1250,&local_12b0.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_12b0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1250);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1250);
    local_1320 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1330,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x56);
    Catch::StringRef::StringRef(&local_1340,"(set & test_flags::a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1310,&local_1320,&local_1330,local_1340,Normal);
    catchAssertionHandler_30.m_resultCapture._0_4_ = 0;
    bVar1 = type_safe::operator&(set,(test_flags *)&catchAssertionHandler_30.m_resultCapture);
    catchAssertionHandler_30.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_30.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1310,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_30.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1310);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1310);
    break;
  case 5:
    local_13a0 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_13b0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x59);
    Catch::StringRef::StringRef(&local_13c0,"set == (test_flags::a | test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1390,&local_13a0,&local_13b0,local_13c0,Normal);
    local_13f8 = (flag_set<test_flags> *)Catch::Decomposer::operator<=(&local_13f9,set);
    local_1400 = a;
    catchAssertionHandler_31.m_resultCapture._4_4_ = 2;
    local_13fa.bits_ =
         (int_type)
         operator|(&stack0xffffffffffffec00,
                   (test_flags *)((long)&catchAssertionHandler_31.m_resultCapture + 4));
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_13f0,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_13f8,&local_13fa
              );
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_1390,&local_13f0.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_13f0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1390);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1390);
    local_1460 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1470,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x5a);
    Catch::StringRef::StringRef(&local_1480,"set == type_safe::combo(~test_flags::b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1450,&local_1460,&local_1470,local_1480,Normal);
    local_14b8 = (flag_set<test_flags> *)
                 Catch::Decomposer::operator<=
                           ((Decomposer *)((long)&catchAssertionHandler_32.m_resultCapture + 7),set)
    ;
    catchAssertionHandler_32.m_resultCapture._0_4_ = 1;
    catchAssertionHandler_32.m_resultCapture._5_1_ =
         operator~((test_flags *)&catchAssertionHandler_32.m_resultCapture);
    catchAssertionHandler_32.m_resultCapture._6_1_ =
         type_safe::combo<test_flags>
                   ((flag_mask<test_flags> *)((long)&catchAssertionHandler_32.m_resultCapture + 5));
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_14b0,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_14b8,
               (flag_set_impl<test_flags,_type_safe::detail::combo_tag> *)
               ((long)&catchAssertionHandler_32.m_resultCapture + 6));
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_1450,&local_14b0.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_14b0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1450);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1450);
    local_1518 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1528,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x5b);
    Catch::StringRef::StringRef(&local_1538,"(set & (test_flags::a | test_flags::c))");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1508,&local_1518,&local_1528,local_1538,Normal);
    local_1540 = a;
    catchAssertionHandler_33.m_resultCapture._4_4_ = 2;
    local_153b.bits_ =
         (int_type)
         operator|(&stack0xffffffffffffeac0,
                   (test_flags *)((long)&catchAssertionHandler_33.m_resultCapture + 4));
    bVar1 = type_safe::operator&(set,&local_153b);
    local_1539 = Catch::Decomposer::operator<=(&local_153a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1508,&local_1539);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1508);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1508);
    break;
  case 6:
    local_15a0 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_15b0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x5e);
    Catch::StringRef::StringRef(&local_15c0,"set == (test_flags::a | test_flags::b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1590,&local_15a0,&local_15b0,local_15c0,Normal);
    local_15f8 = (flag_set<test_flags> *)Catch::Decomposer::operator<=(&local_15f9,set);
    local_1600 = a;
    catchAssertionHandler_34.m_resultCapture._4_4_ = 1;
    local_15fa.bits_ =
         (int_type)
         operator|(&stack0xffffffffffffea00,
                   (test_flags *)((long)&catchAssertionHandler_34.m_resultCapture + 4));
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_15f0,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_15f8,&local_15fa
              );
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_1590,&local_15f0.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_15f0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1590);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1590);
    local_1660 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1670,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x5f);
    Catch::StringRef::StringRef(&local_1680,"set == type_safe::combo(~test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1650,&local_1660,&local_1670,local_1680,Normal);
    local_16b8 = (flag_set<test_flags> *)
                 Catch::Decomposer::operator<=
                           ((Decomposer *)((long)&catchAssertionHandler_35.m_resultCapture + 7),set)
    ;
    catchAssertionHandler_35.m_resultCapture._0_4_ = 2;
    catchAssertionHandler_35.m_resultCapture._5_1_ =
         operator~((test_flags *)&catchAssertionHandler_35.m_resultCapture);
    catchAssertionHandler_35.m_resultCapture._6_1_ =
         type_safe::combo<test_flags>
                   ((flag_mask<test_flags> *)((long)&catchAssertionHandler_35.m_resultCapture + 5));
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_16b0,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_16b8,
               (flag_set_impl<test_flags,_type_safe::detail::combo_tag> *)
               ((long)&catchAssertionHandler_35.m_resultCapture + 6));
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_1650,&local_16b0.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_16b0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1650);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1650);
    local_1718 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1728,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x60);
    Catch::StringRef::StringRef(&local_1738,"(set & (test_flags::a | test_flags::b))");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1708,&local_1718,&local_1728,local_1738,Normal);
    local_1740 = a;
    catchAssertionHandler_36.m_resultCapture._4_4_ = 1;
    local_173b.bits_ =
         (int_type)
         operator|(&stack0xffffffffffffe8c0,
                   (test_flags *)((long)&catchAssertionHandler_36.m_resultCapture + 4));
    bVar1 = type_safe::operator&(set,&local_173b);
    local_1739 = Catch::Decomposer::operator<=(&local_173a,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1708,&local_1739);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1708);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1708);
    break;
  case 7:
    local_17a0 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_17b0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,99);
    Catch::StringRef::StringRef(&local_17c0,"set.all()");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1790,&local_17a0,&local_17b0,local_17c0,Normal);
    bVar1 = type_safe::flag_set<test_flags>::all(set);
    catchAssertionHandler_37.m_resultCapture._7_1_ =
         Catch::Decomposer::operator<=
                   ((Decomposer *)((long)&catchAssertionHandler_37.m_resultCapture + 6),bVar1);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_1790,
               (ExprLhs<bool> *)((long)&catchAssertionHandler_37.m_resultCapture + 7));
    Catch::AssertionHandler::complete((AssertionHandler *)local_1790);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1790);
    local_1820 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1830,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,100);
    Catch::StringRef::StringRef
              (&local_1840,"set == (test_flags::a | test_flags::b | test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1810,&local_1820,&local_1830,local_1840,Normal);
    local_1878 = (flag_set<test_flags> *)Catch::Decomposer::operator<=(&local_1879,set);
    local_1880 = a;
    catchAssertionHandler_38.m_resultCapture._4_4_ = 1;
    local_187b.bits_ =
         (int_type)
         operator|(&stack0xffffffffffffe780,
                   (test_flags *)((long)&catchAssertionHandler_38.m_resultCapture + 4));
    catchAssertionHandler_38.m_resultCapture._0_4_ = 2;
    local_187a.bits_ =
         (int_type)
         type_safe::detail::operator|
                   (&local_187b,(test_flags *)&catchAssertionHandler_38.m_resultCapture);
    Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
              (&local_1870,(ExprLhs<type_safe::flag_set<test_flags>const&> *)&local_1878,&local_187a
              );
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_1810,&local_1870.super_ITransientExpression);
    Catch::
    BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_type_safe::detail::flag_set_impl<test_flags,_type_safe::detail::combo_tag>_&>
    ::~BinaryExpr(&local_1870);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1810);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1810);
    local_18e0 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_18f0,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x65);
    Catch::StringRef::StringRef
              (&local_1900,"(set & (test_flags::a | test_flags::b | test_flags::c))");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_18d0,&local_18e0,&local_18f0,local_1900,Normal);
    local_1908 = a;
    catchAssertionHandler_39.m_resultCapture._4_4_ = 1;
    local_1904.bits_ =
         (int_type)
         operator|(&stack0xffffffffffffe6f8,
                   (test_flags *)((long)&catchAssertionHandler_39.m_resultCapture + 4));
    catchAssertionHandler_39.m_resultCapture._0_4_ = 2;
    local_1903.bits_ =
         (int_type)
         type_safe::detail::operator|
                   (&local_1904,(test_flags *)&catchAssertionHandler_39.m_resultCapture);
    bVar1 = type_safe::operator&(set,&local_1903);
    local_1901 = Catch::Decomposer::operator<=(&local_1902,bVar1);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_18d0,&local_1901);
    Catch::AssertionHandler::complete((AssertionHandler *)local_18d0);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_18d0);
    break;
  default:
    local_1968 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1978,
               "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
               ,0x69);
    Catch::StringRef::StringRef(&local_1988,"false");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_1958,&local_1968,&local_1978,local_1988,Normal);
    local_1989 = Catch::Decomposer::operator<=(&local_198a,false);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_1958,&local_1989);
    Catch::AssertionHandler::complete((AssertionHandler *)local_1958);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1958);
  }
  return;
}

Assistant:

void check_set(const type_safe::flag_set<test_flags>& set, bool a, bool b, bool c)
{
    REQUIRE(set.is_set(test_flags::a) == a);
    REQUIRE(set.as_flag(test_flags::a) == a);
    if (a)
        REQUIRE((set & test_flags::a));

    REQUIRE(set.is_set(test_flags::b) == b);
    REQUIRE(set.as_flag(test_flags::b) == b);
    if (b)
        REQUIRE((set & test_flags::b));

    REQUIRE(set.is_set(test_flags::c) == c);
    REQUIRE(set.as_flag(test_flags::c) == c);
    if (c)
        REQUIRE((set & test_flags::c));

    if (a || b || c)
    {
        REQUIRE(set.any());
        REQUIRE_FALSE(set.none());
        REQUIRE(set != type_safe::noflag);
        REQUIRE(type_safe::noflag != set);
    }
    else
    {
        REQUIRE_FALSE(set.any());
        REQUIRE(set.none());
        REQUIRE(set == type_safe::noflag);
        REQUIRE(type_safe::noflag == set);
    }

    auto number = (a ? 4 : 0) + (b ? 2 : 0) + (c ? 1 : 0);
    switch (number)
    {
    case 0:
        REQUIRE(set == type_safe::flag_set<test_flags>());
        break;
    case 1:
        REQUIRE(set == test_flags::c);
        REQUIRE(set == type_safe::combo(~test_flags::a & ~test_flags::b));
        REQUIRE((set & test_flags::c));
        break;
    case 2:
        REQUIRE(set == test_flags::b);
        REQUIRE(set == type_safe::combo(~test_flags::a & ~test_flags::c));
        REQUIRE((set & test_flags::b));
        break;
    case 3:
        REQUIRE(set == (test_flags::b | test_flags::c));
        REQUIRE(set == type_safe::combo(~test_flags::a));
        REQUIRE((set & (test_flags::b | test_flags::c)));
        break;
    case 4:
        REQUIRE(set == test_flags::a);
        REQUIRE(set == type_safe::combo(~test_flags::b & ~test_flags::c));
        REQUIRE((set & test_flags::a));
        break;
    case 5:
        REQUIRE(set == (test_flags::a | test_flags::c));
        REQUIRE(set == type_safe::combo(~test_flags::b));
        REQUIRE((set & (test_flags::a | test_flags::c)));
        break;
    case 6:
        REQUIRE(set == (test_flags::a | test_flags::b));
        REQUIRE(set == type_safe::combo(~test_flags::c));
        REQUIRE((set & (test_flags::a | test_flags::b)));
        break;
    case 7:
        REQUIRE(set.all());
        REQUIRE(set == (test_flags::a | test_flags::b | test_flags::c));
        REQUIRE((set & (test_flags::a | test_flags::b | test_flags::c)));
        break;

    default:
        REQUIRE(false);
        break;
    }
}